

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O1

Person * __thiscall Controller::findPersonByName(Controller *this,string *name)

{
  int iVar1;
  ostream *poVar2;
  Person *pPVar3;
  _List_node_base *p_Var4;
  list<Person_*,_std::allocator<Person_*>_> *plVar5;
  bool bVar6;
  string local_50;
  
  p_Var4 = (this->players).super__List_base<Person_*,_std::allocator<Person_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  plVar5 = &this->players;
  if (p_Var4 != (_List_node_base *)plVar5) {
    do {
      Person::getName_abi_cxx11_(&local_50,(Person *)p_Var4[1]._M_next);
      if (local_50._M_string_length == name->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_50._M_string_length)
          ;
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while ((!bVar6) && (p_Var4 = p_Var4->_M_next, p_Var4 != (_List_node_base *)plVar5));
  }
  if (p_Var4 == (_List_node_base *)plVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"La personne ",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," n\'existe pas",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    pPVar3 = (Person *)0x0;
  }
  else {
    pPVar3 = (Person *)p_Var4[1]._M_next;
  }
  return pPVar3;
}

Assistant:

Person* Controller::findPersonByName(const string& name) const {
    // Searches in the list of persons
    auto it = std::find_if(players.begin(), players.end(),
               [&name](const Person* p) {return p->getName() == name;});
    if (it == players.end()) {
        cout << "La personne " << name << " n'existe pas" << endl;
        return nullptr;
    }
    return *it;
}